

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_b4327e::X509Test_NoBasicConstraintsCertSign_Test::TestBody
          (X509Test_NoBasicConstraintsCertSign_Test *this)

{
  void *pvVar1;
  int iVar2;
  char *message;
  char *in_R9;
  _Any_data *configure_callback;
  pointer *__ptr;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  AssertionResult gtest_ar_;
  UniquePtr<X509> intermediate;
  UniquePtr<X509> leaf;
  UniquePtr<X509> root;
  AssertionResult gtest_ar;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  pointer local_d0;
  AssertHelper local_c8 [2];
  string local_b8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_98;
  _Head_base<0UL,_x509_st_*,_false> local_80;
  allocator_type local_72;
  allocator_type local_71;
  _Head_base<0UL,_x509_st_*,_false> local_70;
  _Head_base<0UL,_x509_st_*,_false> local_68;
  internal local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  int local_50;
  int local_4c;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  _Head_base<0UL,_x509_st_*,_false> local_28;
  x509_st *local_20;
  
  CertFromPEM((anon_unknown_dwarf_b4327e *)&local_68,
              "\n-----BEGIN CERTIFICATE-----\nMIICTTCCAbagAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwKzEXMBUGA1UE\nChMOQm9yaW5nU1NMIFRlc3QxEDAOBgNVBAMTB1Jvb3QgQ0EwHhcNMTUwMTAxMDAw\nMDAwWhcNMjUwMTAxMDAwMDAwWjArMRcwFQYDVQQKEw5Cb3JpbmdTU0wgVGVzdDEQ\nMA4GA1UEAxMHUm9vdCBDQTCBnzANBgkqhkiG9w0BAQEFAAOBjQAwgYkCgYEA6Q5/\nEQzmWuaGg3D2UQcuAngR9bIkkjjuJmICx5TxPqF3asCP1SJotl3iTNrghRE1wpJy\nSY2BtIiXa7f8skRb2U0GcPkMxo/ps9+jaoRsQ1m+nbLQdpvD1/qZWcO45fNTA71J\n1rPMokP+rcILuQG4VimUAySnDSghKamulFtK+Z8CAwEAAaN6MHgwDgYDVR0PAQH/\nBAQDAgIEMB0GA1UdJQQWMBQGCCsGAQUFBwMBBggrBgEFBQcDAjAPBgNVHRMBAf8E\nBTADAQH/MBkGA1UdDgQSBBBAN9cB+0AvuBx+VAQnjFkBMBsGA1UdIwQUMBKAEEA3\n1wH7QC+4HH5UBCeMWQEwDQYJKoZIhvcNAQELBQADgYEAc4N6hTE62/3gwg+kyc2f\nc/Jj1mHrOt+0NRaBnmvbmNpsEjHS96Ef4Wt/ZlPXPkkv1C1VosJnOIMF3Q522wRH\nbqaxARldS12VAa3gcWisDWD+SqSyDxjyojz0XDiJkTrFuCTCUiZO+1GLB7SO10Ms\nd5YVX0c90VMnUhF/dlrqS9U=\n-----END CERTIFICATE-----\n"
             );
  CertFromPEM((anon_unknown_dwarf_b4327e *)&local_80,
              "\n-----BEGIN CERTIFICATE-----\nMIIBqjCCAROgAwIBAgIBAjANBgkqhkiG9w0BAQsFADArMRcwFQYDVQQKEw5Cb3Jp\nbmdTU0wgVGVzdDEQMA4GA1UEAxMHUm9vdCBDQTAgFw0wMDAxMDEwMDAwMDBaGA8y\nMDk5MDEwMTAwMDAwMFowHzEdMBsGA1UEAxMUTm8gQmFzaWMgQ29uc3RyYWludHMw\nWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAASEFMblfxIEDO8My7wHtHWTuDzNyID1\nOsPkMGkn32O/pSyXxXuAqDeFoMVffUMTyfm8JcYugSEbrv2qEXXM4bZRoy8wLTAO\nBgNVHQ8BAf8EBAMCAgQwGwYDVR0jBBQwEoAQQDfXAftAL7gcflQEJ4xZATANBgkq\nhkiG9w0BAQsFAAOBgQC1Lh6hIAm3K5kRh5iIydU0YAEm7eV6ZSskERDUq3DLJyl9\nZUZCHUzvb464dkwZjeNzaUVS1pdElJslwX3DtGgeJLJGCnk8zUjBjaNrrDm0kzPW\nxKt/6oif1ci/KCKqKNXJAIFbc4e+IiBpenwpxHk3If4NM+Ek0nKoO8Uj0NkgTQ==\n-----END CERTIFICATE-----\n"
             );
  CertFromPEM((anon_unknown_dwarf_b4327e *)&local_70,
              "\n-----BEGIN CERTIFICATE-----\nMIIBUDCB96ADAgECAgEDMAoGCCqGSM49BAMCMB8xHTAbBgNVBAMTFE5vIEJhc2lj\nIENvbnN0cmFpbnRzMCAXDTAwMDEwMTAwMDAwMFoYDzIwOTkwMTAxMDAwMDAwWjAx\nMS8wLQYDVQQDEyZMZWFmIGZyb20gQ0Egd2l0aCBubyBCYXNpYyBDb25zdHJhaW50\nczBZMBMGByqGSM49AgEGCCqGSM49AwEHA0IABEsYPMwzdJKjB+2gpC90ib2ilHoB\nw/arQ6ikUX0CNUDDaKaOu/jF39ogzVlg4lDFrjCKShSfCCcrwgONv70IZGijEDAO\nMAwGA1UdEwEB/wQCMAAwCgYIKoZIzj0EAwIDSAAwRQIgbV7R99yM+okXSIs6Fp3o\neCOXiDL60IBxaTOcLS44ywcCIQDbn87Gj5cFgHBYAkzdHqDsyGXkxQTHDq9jmX24\nDjy3Zw==\n-----END CERTIFICATE-----\n"
             );
  local_e0[0] = (internal)(local_68._M_head_impl != (x509_st *)0x0);
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68._M_head_impl == (x509_st *)0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_e0,(AssertionResult *)0x5c83c3,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xb73,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
  }
  else {
    local_e0[0] = (internal)((X509 *)local_80._M_head_impl != (X509 *)0x0);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((X509 *)local_80._M_head_impl == (X509 *)0x0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,(internal *)local_e0,(AssertionResult *)0x5a5ffb,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xb74,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    }
    else {
      local_e0[0] = (internal)(local_70._M_head_impl != (X509 *)0x0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_70._M_head_impl == (X509 *)0x0) {
        testing::Message::Message((Message *)&local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_b8,(internal *)local_e0,(AssertionResult *)0x5a6039,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xb75,local_b8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
      }
      else {
        local_50 = 0x18;
        local_20 = local_68._M_head_impl;
        __l._M_len = 1;
        __l._M_array = &local_20;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l,&local_71);
        local_28._M_head_impl = local_80._M_head_impl;
        __l_00._M_len = 1;
        __l_00._M_array = &local_28._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_e0,__l_00,&local_72);
        local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        configure_callback = &local_48;
        local_48._M_unused._M_object = (void *)0x0;
        local_48._8_8_ = 0;
        local_38 = (code *)0x0;
        uStack_30 = 0;
        local_4c = Verify(local_70._M_head_impl,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_e0,&local_98,0,
                          (function<void_(x509_store_ctx_st_*)> *)configure_callback);
        testing::internal::CmpHelperEQ<int,int>
                  (local_60,"24","Verify(leaf.get(), {root.get()}, {intermediate.get()}, {}, 0)",
                   &local_50,&local_4c);
        if (local_38 != (code *)0x0) {
          (*local_38)(&local_48,&local_48,__destroy_functor);
        }
        if (local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.
                                super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.
                                super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar1 = (void *)CONCAT71(local_e0._1_7_,local_e0[0]);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,(long)local_d0 - (long)pvVar1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_b8._M_dataplus._M_p,
                          local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
        }
        if (local_60[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b8);
          if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = "";
          }
          else {
            message = (local_58->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb7a,message);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_b8._M_dataplus._M_p + 8))();
          }
        }
        if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_58,local_58);
        }
        iVar2 = X509_check_purpose((X509 *)local_80._M_head_impl,-1,1);
        local_e0[0] = (internal)(iVar2 != 0);
        local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_e0[0]) {
          testing::Message::Message((Message *)&local_98);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_b8,(internal *)local_e0,
                     (AssertionResult *)"X509_check_purpose(intermediate.get(), -1, 1)","false",
                     "true",configure_callback->_M_pod_data);
          testing::internal::AssertHelper::AssertHelper
                    (local_c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb7f,local_b8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)(*local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
          }
        }
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d8,local_d8);
        }
        iVar2 = X509_check_purpose((X509 *)local_80._M_head_impl,7,1);
        local_e0[0] = (internal)(iVar2 != 0);
        local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_e0[0]) {
          testing::Message::Message((Message *)&local_98);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_b8,(internal *)local_e0,
                     (AssertionResult *)"X509_check_purpose(intermediate.get(), 7, 1)","false",
                     "true",configure_callback->_M_pod_data);
          testing::internal::AssertHelper::AssertHelper
                    (local_c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xb81,local_b8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)(*local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
          }
        }
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d8,local_d8);
        }
        iVar2 = X509_check_purpose((X509 *)local_80._M_head_impl,2,1);
        local_e0[0] = (internal)(iVar2 == 0);
        local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_e0[0]) goto LAB_003c9645;
        testing::Message::Message((Message *)&local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_b8,(internal *)local_e0,
                   (AssertionResult *)"X509_check_purpose(intermediate.get(), 2, 1)","true","false",
                   configure_callback->_M_pod_data);
        testing::internal::AssertHelper::AssertHelper
                  (local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xb83,local_b8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)(*local_98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start)->sig_alg)();
  }
LAB_003c9645:
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_70);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_80);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_68);
  return;
}

Assistant:

TEST(X509Test, NoBasicConstraintsCertSign) {
  bssl::UniquePtr<X509> root(CertFromPEM(kSANTypesRoot));
  bssl::UniquePtr<X509> intermediate(
      CertFromPEM(kNoBasicConstraintsCertSignIntermediate));
  bssl::UniquePtr<X509> leaf(CertFromPEM(kNoBasicConstraintsCertSignLeaf));

  ASSERT_TRUE(root);
  ASSERT_TRUE(intermediate);
  ASSERT_TRUE(leaf);

  // The intermediate has keyUsage certSign, but is not marked as a CA in the
  // basicConstraints.
  EXPECT_EQ(X509_V_ERR_INVALID_CA,
            Verify(leaf.get(), {root.get()}, {intermediate.get()}, {}, 0));

  // |X509_check_purpose| with |X509_PURPOSE_ANY| and purpose -1 do not check
  // basicConstraints, but other purpose types do. (This is redundant with the
  // actual basicConstraints check, but |X509_check_purpose| is public API.)
  EXPECT_TRUE(X509_check_purpose(intermediate.get(), -1, /*ca=*/1));
  EXPECT_TRUE(
      X509_check_purpose(intermediate.get(), X509_PURPOSE_ANY, /*ca=*/1));
  EXPECT_FALSE(X509_check_purpose(intermediate.get(), X509_PURPOSE_SSL_SERVER,
                                  /*ca=*/1));
}